

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O1

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffDeclGroup(NodeDiffComputer *this,DeclGroup *lhs,DeclGroup *rhs)

{
  int iVar1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  ulong uVar5;
  
  iVar1 = (lhs->_decls)._size - (rhs->_decls)._size;
  if (iVar1 == 0) {
    if ((lhs->_decls)._size == 0) {
      iVar3 = 0;
    }
    else {
      uVar5 = 0;
      iVar3 = 0;
      do {
        iVar2 = diffVarDecl(this,(lhs->_decls)._vals[uVar5],(rhs->_decls)._vals[uVar5]);
        if (this->limit < iVar2) {
          return iVar2;
        }
        iVar3 = iVar3 + iVar2;
        uVar5 = uVar5 + 1;
      } while (uVar5 < (lhs->_decls)._size);
    }
  }
  else {
    iVar4 = -iVar1;
    if (0 < iVar1) {
      iVar4 = iVar1;
    }
    iVar3 = iVar4 * (this->DiffCosts).SizeDiffCoeff + (this->DiffCosts).SizeDiffCost;
  }
  return iVar3;
}

Assistant:

int32_t diffDeclGroup(const DeclGroup *lhs, const DeclGroup *rhs) {
    const auto &leftGroup = lhs->declarations();
    const auto &rightGroup = rhs->declarations();

    if (leftGroup.size() != rightGroup.size())
      return sizeDiff(leftGroup.size(), rightGroup.size());

    int32_t result = 0;

    for (int32_t i = 0; i < leftGroup.size(); ++i) {
      const VarDecl *l = leftGroup[i];
      const VarDecl *r = rightGroup[i];

      int32_t tmp = diffVarDecl(l, r);

      if (tmp > limit)
        return tmp;

      result += tmp;
    }

    return result;
  }